

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall QPDFArgParser::handleCompletion(QPDFArgParser *this)

{
  bool bVar1;
  __type_conflict1 _Var2;
  char *pcVar3;
  long lVar4;
  element_type *peVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  string prefix;
  string candidate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string extra_prefix;
  
  extra_prefix._M_dataplus._M_p = (pointer)&extra_prefix.field_2;
  extra_prefix._M_string_length = 0;
  extra_prefix.field_2._M_local_buf[0] = '\0';
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (*(size_t *)((long)&(peVar5->completions)._M_t._M_impl.super__Rb_tree_header + 0x20) != 0)
  goto LAB_00150458;
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  if (((peVar5->bash_cur)._M_string_length == 0) && (2 < (peVar5->bash_prev)._M_string_length)) {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)&peVar5->bash_prev);
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (*pcVar3 != '-') goto LAB_001502b4;
    pcVar3 = (char *)std::__cxx11::string::at((ulong)&peVar5->bash_prev);
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (*pcVar3 != '-') goto LAB_001502b4;
    pcVar3 = (char *)std::__cxx11::string::at((ulong)&peVar5->bash_line);
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (*pcVar3 != '=') goto LAB_001502b4;
    std::__cxx11::string::substr((ulong)&candidate,(ulong)&peVar5->bash_prev);
    std::__cxx11::string::operator=((string *)&prefix,(string *)&candidate);
LAB_001503a8:
    std::__cxx11::string::~string((string *)&candidate);
  }
  else {
LAB_001502b4:
    bVar1 = std::operator==(&peVar5->bash_prev,"=");
    if ((((bVar1) &&
         (peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,
         (peVar5->bash_cur)._M_string_length + 1 < (peVar5->bash_line)._M_string_length)) &&
        (pcVar3 = (char *)std::__cxx11::string::at((ulong)&peVar5->bash_line), *pcVar3 == '=')) &&
       (lVar4 = std::__cxx11::string::rfind
                          ((char)(this->m).
                                 super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + -0x68,0x20), lVar4 != -1)) {
      std::__cxx11::string::substr
                ((ulong)&candidate,
                 (ulong)&((this->m).
                          super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->bash_line);
      if (((2 < candidate._M_string_length) &&
          (pcVar3 = (char *)std::__cxx11::string::at((ulong)&candidate), *pcVar3 == '-')) &&
         (pcVar3 = (char *)std::__cxx11::string::at((ulong)&candidate), *pcVar3 == '-')) {
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&candidate);
        std::__cxx11::string::operator=((string *)&prefix,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      goto LAB_001503a8;
    }
  }
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar5->zsh_completion == true) && (prefix._M_string_length != 0)) {
    std::operator+(&local_70,"--",&prefix);
    std::operator+(&candidate,&local_70,"=");
    std::__cxx11::string::operator=((string *)&extra_prefix,(string *)&candidate);
    std::__cxx11::string::~string((string *)&candidate);
    std::__cxx11::string::~string((string *)&local_70);
    peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
  }
  insertCompletions(this,peVar5->option_table,&prefix,&extra_prefix);
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5->argc == 1) {
    insertCompletions(this,&peVar5->help_option_table,&prefix,&extra_prefix);
  }
  std::__cxx11::string::~string((string *)&prefix);
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00150458:
  std::operator+(&prefix,&extra_prefix,&peVar5->bash_cur);
  peVar5 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var7 = *(_Base_ptr *)((long)&(peVar5->completions)._M_t._M_impl.super__Rb_tree_header + 0x10);
  do {
    if (p_Var7 == &(peVar5->completions)._M_t._M_impl.super__Rb_tree_header._M_header) {
      exit(0);
    }
    if (prefix._M_string_length == 0) {
LAB_001504c5:
      poVar6 = std::operator<<((ostream *)&std::cout,(string *)(p_Var7 + 1));
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      std::__cxx11::string::substr((ulong)&candidate,(ulong)(p_Var7 + 1));
      _Var2 = std::operator==(&candidate,&prefix);
      std::__cxx11::string::~string((string *)&candidate);
      if (_Var2) goto LAB_001504c5;
    }
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void
QPDFArgParser::handleCompletion()
{
    std::string extra_prefix;
    if (m->completions.empty()) {
        // Detect --option=... Bash treats the = as a word separator.
        std::string choice_option;
        if (m->bash_cur.empty() && (m->bash_prev.length() > 2) && (m->bash_prev.at(0) == '-') &&
            (m->bash_prev.at(1) == '-') && (m->bash_line.at(m->bash_line.length() - 1) == '=')) {
            choice_option = m->bash_prev.substr(2, std::string::npos);
        } else if ((m->bash_prev == "=") && (m->bash_line.length() > (m->bash_cur.length() + 1))) {
            // We're sitting at --option=x. Find previous option.
            size_t end_mark = m->bash_line.length() - m->bash_cur.length() - 1;
            char before_cur = m->bash_line.at(end_mark);
            if (before_cur == '=') {
                size_t space = m->bash_line.find_last_of(' ', end_mark);
                if (space != std::string::npos) {
                    std::string candidate = m->bash_line.substr(space + 1, end_mark - space - 1);
                    if ((candidate.length() > 2) && (candidate.at(0) == '-') &&
                        (candidate.at(1) == '-')) {
                        choice_option = candidate.substr(2, std::string::npos);
                    }
                }
            }
        }
        if (m->zsh_completion && (!choice_option.empty())) {
            // zsh wants --option=choice rather than just choice
            extra_prefix = "--" + choice_option + "=";
        }
        insertCompletions(*m->option_table, choice_option, extra_prefix);
        if (m->argc == 1) {
            // Help options are valid only by themselves.
            insertCompletions(m->help_option_table, choice_option, extra_prefix);
        }
    }
    std::string prefix = extra_prefix + m->bash_cur;
    for (auto const& iter: m->completions) {
        if (prefix.empty() || (iter.substr(0, prefix.length()) == prefix)) {
            std::cout << iter << std::endl;
        }
    }
    exit(0);
}